

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# System.h
# Opt level: O0

shared_ptr<entityx::deps::Dependency<A,_B>_> __thiscall
entityx::SystemManager::add<entityx::deps::Dependency<A,B>>(SystemManager *this)

{
  undefined8 *puVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Dependency<A,_B> *in_RDI;
  shared_ptr<entityx::deps::Dependency<A,_B>_> sVar2;
  SystemManager *unaff_retaddr;
  shared_ptr<entityx::deps::Dependency<A,_B>_> *s;
  Dependency<A,_B> *in_stack_ffffffffffffff98;
  Dependency<A,_B> *system;
  
  system = in_RDI;
  puVar1 = (undefined8 *)operator_new(0x48);
  puVar1[6] = 0;
  puVar1[7] = 0;
  puVar1[4] = 0;
  puVar1[5] = 0;
  puVar1[2] = 0;
  puVar1[3] = 0;
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1[8] = 0;
  deps::Dependency<A,_B>::Dependency(in_RDI);
  std::shared_ptr<entityx::deps::Dependency<A,B>>::shared_ptr<entityx::deps::Dependency<A,B>,void>
            ((shared_ptr<entityx::deps::Dependency<A,_B>_> *)in_RDI,in_stack_ffffffffffffff98);
  Catch::clara::std::shared_ptr<entityx::deps::Dependency<A,_B>_>::shared_ptr
            ((shared_ptr<entityx::deps::Dependency<A,_B>_> *)in_RDI,
             (shared_ptr<entityx::deps::Dependency<A,_B>_> *)in_stack_ffffffffffffff98);
  add<entityx::deps::Dependency<A,B>>
            (unaff_retaddr,(shared_ptr<entityx::deps::Dependency<A,_B>_> *)system);
  Catch::clara::std::shared_ptr<entityx::deps::Dependency<A,_B>_>::~shared_ptr
            ((shared_ptr<entityx::deps::Dependency<A,_B>_> *)0x2b3059);
  sVar2.super___shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       in_RDI;
  return (shared_ptr<entityx::deps::Dependency<A,_B>_>)
         sVar2.super___shared_ptr<entityx::deps::Dependency<A,_B>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<S> add(Args && ... args) {
    std::shared_ptr<S> s(new S(std::forward<Args>(args) ...));
    add(s);
    return s;
  }